

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::PostprocessHelper_CollectMetadata
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,
          list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *pList)

{
  size_t *psVar1;
  EType EVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  p_Var3 = (pNodeElement->Child).
           super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var3 == (_List_node_base *)&pNodeElement->Child) {
      return;
    }
    EVar2 = ((CX3DImporter_NodeElement *)p_Var3[1]._M_next)->Type;
    if (EVar2 - ENET_MetaBoolean < 4) {
LAB_00646292:
      p_Var4 = (_List_node_base *)operator_new(0x18);
      p_Var4[1]._M_next = p_Var3[1]._M_next;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(pList->
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    else if (EVar2 == ENET_MetaSet) {
      PostprocessHelper_CollectMetadata(this,(CX3DImporter_NodeElement *)p_Var3[1]._M_next,pList);
    }
    else if (EVar2 == ENET_MetaString) goto LAB_00646292;
    p_Var3 = p_Var3->_M_next;
  } while( true );
}

Assistant:

void X3DImporter::PostprocessHelper_CollectMetadata(const CX3DImporter_NodeElement& pNodeElement, std::list<CX3DImporter_NodeElement*>& pList) const
{
	// walk through childs and find for metadata.
	for(std::list<CX3DImporter_NodeElement*>::const_iterator el_it = pNodeElement.Child.begin(); el_it != pNodeElement.Child.end(); ++el_it)
	{
		if(((*el_it)->Type == CX3DImporter_NodeElement::ENET_MetaBoolean) || ((*el_it)->Type == CX3DImporter_NodeElement::ENET_MetaDouble) ||
			((*el_it)->Type == CX3DImporter_NodeElement::ENET_MetaFloat) || ((*el_it)->Type == CX3DImporter_NodeElement::ENET_MetaInteger) ||
			((*el_it)->Type == CX3DImporter_NodeElement::ENET_MetaString))
		{
			pList.push_back(*el_it);
		}
		else if((*el_it)->Type == CX3DImporter_NodeElement::ENET_MetaSet)
		{
			PostprocessHelper_CollectMetadata(**el_it, pList);
		}
	}// for(std::list<CX3DImporter_NodeElement*>::const_iterator el_it = pNodeElement.Child.begin(); el_it != pNodeElement.Child.end(); el_it++)
}